

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::ClipControlDepthModeZeroToOneTest::iterate(ClipControlDepthModeZeroToOneTest *this)

{
  TestLog *log;
  RenderContext *renderCtx;
  TestContext *this_00;
  int iVar1;
  deUint32 err;
  qpTestResult result;
  undefined4 extraout_var;
  ShaderProgram *this_01;
  char *description;
  TestError *this_02;
  allocator<char> local_16a;
  allocator<char> local_169;
  SharedPtr<glu::ShaderProgram> program;
  string local_158;
  string local_138;
  ClipControlApi cc;
  float vertex_data0 [12];
  long lVar2;
  
  log = ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
         super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar1 = (*((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
            m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  ClipControlApi::ClipControlApi
            (&cc,(this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
                 m_context,(this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.m_api);
  (**(code **)(lVar2 + 0x1c0))(0x3f800000,0,0,0x3f800000);
  (**(code **)(lVar2 + 0x188))(0x4000);
  (**(code **)(lVar2 + 0x1c8))(0);
  (**(code **)(lVar2 + 0x188))(0x100);
  (*cc.clipControl)(0x8ca1,0x935f);
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"ClipControl()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
                  ,0x27a);
  (**(code **)(lVar2 + 0x5e0))(0xb71);
  (**(code **)(lVar2 + 0x4a0))(0x207);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
              m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,
             "#version 400\nin vec3 Position;\nvoid main() {\n    gl_Position = vec4(Position, 1.0);\n}"
             ,&local_169);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,
             "#version 400\nout vec4 FragColor;\nvoid main() {\n    FragColor = vec4(0.0, 1.0, 0.0, 1.0);\n}"
             ,&local_16a);
  glu::makeVtxFragSources((ProgramSources *)vertex_data0,&local_138,&local_158);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,(ProgramSources *)vertex_data0);
  de::SharedPtr<glu::ShaderProgram>::SharedPtr(&program,this_01);
  glu::ProgramSources::~ProgramSources((ProgramSources *)vertex_data0);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  glu::operator<<(log,program.m_ptr);
  if (((program.m_ptr)->m_program).m_info.linkOk != false) {
    (**(code **)(lVar2 + 0x708))(1,&this->m_vao);
    (**(code **)(lVar2 + 0xd8))(this->m_vao);
    (**(code **)(lVar2 + 0x6c8))(1,&this->m_vbo);
    vertex_data0[8] = 0.0;
    vertex_data0[9] = 1.0;
    vertex_data0[10] = 1.0;
    vertex_data0[0xb] = 1.0;
    vertex_data0[4] = -1.0;
    vertex_data0[5] = 0.0;
    vertex_data0[6] = -1.0;
    vertex_data0[7] = 1.0;
    vertex_data0[0] = -1.0;
    vertex_data0[1] = -1.0;
    vertex_data0[2] = -1.0;
    vertex_data0[3] = 1.0;
    (**(code **)(lVar2 + 0x40))(0x8892,this->m_vbo);
    (**(code **)(lVar2 + 0x150))(0x8892,0x30,vertex_data0,0x88e4);
    (**(code **)(lVar2 + 0x19f0))(0,3,0x1406,0,0,0);
    (**(code **)(lVar2 + 0x610))(0);
    (**(code **)(lVar2 + 0x1680))(((program.m_ptr)->m_program).m_program);
    (**(code **)(lVar2 + 0x538))(5,0,4);
    result = ValidateFramebuffer(this,(this->super_ClipControlRenderBaseTest).
                                      super_ClipControlBaseTest.super_TestCase.m_context);
    this_00 = (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
              super_TestCase.super_TestNode.m_testCtx;
    description = qpGetTestResultName(result);
    tcu::TestContext::setTestResult(this_00,result,description);
    de::SharedPtr<glu::ShaderProgram>::~SharedPtr(&program);
    return STOP;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
             ,0x287);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate()
	{

		tcu::TestLog&		  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		ClipControlApi		  cc(m_context, m_api);

		gl.clearColor(1.0, 0.0, 0.0, 1.0);
		gl.clear(GL_COLOR_BUFFER_BIT);

		//Clear the depth buffer to 0.5.
		gl.clearDepth(0.5);
		gl.clear(GL_DEPTH_BUFFER_BIT);

		//Set ClipControl(LOWER_LEFT, ZERO_TO_ONE)
		cc.clipControl(GL_LOWER_LEFT, GL_ZERO_TO_ONE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ClipControl()");

		//Enable(DEPTH_TEST) with DepthFunc(ALWAYS)
		gl.enable(GL_DEPTH_TEST);
		gl.depthFunc(GL_ALWAYS);

		//Render a triangle fan coverage (-1.0,-1.0,-1.0) to (1.0,1.0,1.0).
		de::SharedPtr<glu::ShaderProgram> program(
			new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vsh(), fsh())));

		log << (*program);
		if (!program->isOk())
		{
			TCU_FAIL("Program compilation failed");
		}

		gl.genVertexArrays(1, &m_vao);
		gl.bindVertexArray(m_vao);

		gl.genBuffers(1, &m_vbo);

		const float vertex_data0[] = {
			-1.0, -1.0, -1.0, 1.0, -1.0, 0.0, -1.0, 1.0, 0.0, 1.0, 1.0, 1.0,
		};

		gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertex_data0), vertex_data0, GL_STATIC_DRAW);

		gl.vertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 0, 0);
		gl.enableVertexAttribArray(0);

		gl.useProgram(program->getProgram());

		//test method modification: use GL_TRIANGLE_STRIP, not FAN.
		gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);

		//Read back the floating-point depth buffer with ReadPixels
		//Verify that the pixels with a Z clip coordinate less than 0.0 are
		//  clipped and those coordinates from 0.0 to 1.0 update the depth
		//  buffer with values 0.0 to 1.0.
		qpTestResult result = ValidateFramebuffer(m_context);
		m_testCtx.setTestResult(result, qpGetTestResultName(result));

		return STOP;
	}